

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdns.cpp
# Opt level: O0

uint8_t * __thiscall
cdns_query::parse_map_item(cdns_query *this,uint8_t *old_in,uint8_t *in_max,int64_t val,int *err)

{
  bool bVar1;
  uint8_t *local_38;
  uint8_t *in;
  int *err_local;
  int64_t val_local;
  uint8_t *in_max_local;
  uint8_t *old_in_local;
  cdns_query *this_local;
  
  bVar1 = cdns::is_old_version(this->current_block->current_cdns);
  if (bVar1) {
    local_38 = parse_map_item_old(this,old_in,in_max,val,err);
  }
  else {
    switch(val) {
    case 0:
      local_38 = cbor_parse_int(old_in,in_max,&this->time_offset_usec,1,err);
      break;
    case 1:
      local_38 = cbor_parse_int(old_in,in_max,&this->client_address_index,0,err);
      break;
    case 2:
      local_38 = cbor_parse_int(old_in,in_max,&this->client_port,0,err);
      break;
    case 3:
      local_38 = cbor_parse_int(old_in,in_max,&this->transaction_id,0,err);
      break;
    case 4:
      local_38 = cbor_parse_int(old_in,in_max,&this->query_signature_index,0,err);
      break;
    case 5:
      local_38 = cbor_parse_int(old_in,in_max,&this->client_hoplimit,0,err);
      break;
    case 6:
      local_38 = cbor_parse_int(old_in,in_max,&this->delay_useconds,1,err);
      break;
    case 7:
      local_38 = cbor_parse_int(old_in,in_max,&this->query_name_index,0,err);
      break;
    case 8:
      local_38 = cbor_parse_int(old_in,in_max,&this->query_size,0,err);
      break;
    case 9:
      local_38 = cbor_parse_int(old_in,in_max,&this->response_size,0,err);
      break;
    case 10:
      local_38 = cdns_response_processing_data::parse(&this->rpd,old_in,in_max,err);
      break;
    case 0xb:
      local_38 = cdns_qr_extended::parse(&this->q_extended,old_in,in_max,err);
      break;
    case 0xc:
      local_38 = cdns_qr_extended::parse(&this->r_extended,old_in,in_max,err);
      break;
    default:
      local_38 = cbor_skip(old_in,in_max,err);
    }
    if (local_38 == (uint8_t *)0x0) {
      fprintf(_stderr,"\nError %d parsing query field type %d\n",(ulong)(uint)*err,val & 0xffffffff)
      ;
    }
  }
  return local_38;
}

Assistant:

uint8_t* cdns_query::parse_map_item(uint8_t* old_in, uint8_t const* in_max, int64_t val, int* err)
{
    uint8_t* in = old_in;

    if (current_block->current_cdns->is_old_version()) {
        in = parse_map_item_old(in, in_max, val, err);
    }
    else {
        switch (val) {
        case 0: // time_useconds
            in = cbor_parse_int(in, in_max, &time_offset_usec, 1, err);
            break;
        case 1: // client_address_index
            in = cbor_parse_int(in, in_max, &client_address_index, 0, err);
            break;
        case 2: // client_port,
            in = cbor_parse_int(in, in_max, &client_port, 0, err);
            break;
        case 3: // transaction_id
            in = cbor_parse_int(in, in_max, &transaction_id, 0, err);
            break;
        case 4: // query_signature_index
            in = cbor_parse_int(in, in_max, &query_signature_index, 0, err);
            break;
        case 5: // client_hoplimit
            in = cbor_parse_int(in, in_max, &client_hoplimit, 0, err);
            break;
        case 6: // delay_useconds
            in = cbor_parse_int(in, in_max, &delay_useconds, 1, err);
            break;
        case 7: // query_name_index
            in = cbor_parse_int(in, in_max, &query_name_index, 0, err);
            break;
        case 8: // query_size
            in = cbor_parse_int(in, in_max, &query_size, 0, err);
            break;
        case 9: // response_size
            in = cbor_parse_int(in, in_max, &response_size, 0, err);
            break;
        case 10: // ResponseProcessingData
            in = rpd.parse(in, in_max, err);
            break;
        case 11: // query_extended
            in = q_extended.parse(in, in_max, err);
            break;
        case 12: // response_extended,\n");
            in = r_extended.parse(in, in_max, err);
            break;
        default:
            /* TODO: something */
            in = cbor_skip(in, in_max, err);
            break;
        }

        if (in == NULL) {
            fprintf(stderr, "\nError %d parsing query field type %d\n", *err, (int)val);
        }
    }

    return in;
}